

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O2

void skiwi::skiwi_repl(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  size_type *psVar3;
  runtime_error *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  string command;
  string arg;
  string input;
  string local_d0 [32];
  string filename;
  string local_90 [32];
  string local_70;
  string local_50 [32];
  
  if ((anonymous_namespace)::cd != '\x01') {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Skiwi is not initialized");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  for (lVar5 = 1; lVar5 < argc; lVar5 = lVar5 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filename,argv[lVar5],(allocator<char> *)&local_150);
    skiwi_runf(&filename);
    std::__cxx11::string::~string((string *)&filename);
  }
  (anonymous_namespace)::out<std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (anonymous_namespace)::welcome_message_abi_cxx11_);
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length = 0;
  input.field_2._M_local_buf[0] = '\0';
  do {
    while( true ) {
      if (DAT_002b39a8 != (ostream *)0x0) {
        std::operator<<(DAT_002b39a8,(anonymous_namespace)::prompt_abi_cxx11_);
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&input);
      std::__cxx11::string::string((string *)&local_70,(string *)&input);
      bVar2 = anon_unknown_1::is_cmd_command(&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar2) break;
      if (input._M_string_length != 0) {
        skiwi_run(&input);
      }
    }
    std::__cxx11::string::string(local_90,(string *)&input);
    std::__cxx11::string::string((string *)&filename,local_90);
    bVar2 = anon_unknown_1::is_cmd_command(&filename);
    if (!bVar2) {
      __assert_fail("is_cmd_command(txt)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/libskiwi.cpp"
                    ,0x25b,
                    "std::string skiwi::(anonymous namespace)::get_cleaned_command(std::string)");
    }
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::find_first_not_of((char)local_90,0x20);
    std::__cxx11::string::substr((ulong)&local_150,(ulong)local_90);
    lVar5 = std::__cxx11::string::find((char)&local_150,0x20);
    if (lVar5 == -1) {
      if (local_150 == &local_140) {
        command.field_2._8_8_ = local_140._8_8_;
        command._M_dataplus._M_p = (pointer)&command.field_2;
      }
      else {
        command._M_dataplus._M_p = (pointer)local_150;
      }
      command.field_2._M_allocated_capacity._1_7_ = local_140._M_allocated_capacity._1_7_;
      command.field_2._M_local_buf[0] = local_140._M_local_buf[0];
      command._M_string_length = local_148;
      local_148 = 0;
      local_140._M_local_buf[0] = '\0';
      local_150 = &local_140;
    }
    else {
      std::__cxx11::string::substr((ulong)&command,(ulong)&local_150);
    }
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string(local_90);
    if (1 < command._M_string_length) {
      cVar1 = command._M_dataplus._M_p[1];
      if (cVar1 == '?') {
        bVar2 = std::operator==(&command,",?");
        if (bVar2) {
          skiwi_show_help();
        }
      }
      else if (cVar1 == 'a') {
        bVar2 = std::operator==(&command,",asm");
        if (bVar2) {
          skiwi_show_assembly(&input);
        }
      }
      else if (cVar1 == 'e') {
        bVar2 = std::operator==(&command,",env");
        if (bVar2) {
          skiwi_show_environment();
        }
        else {
          bVar2 = std::operator==(&command,",exit");
          if (bVar2) {
            std::__cxx11::string::~string((string *)&command);
            std::__cxx11::string::~string((string *)&input);
            return;
          }
          bVar2 = std::operator==(&command,",expand");
          if (bVar2) {
            skiwi_show_expand(&input);
          }
          else {
            bVar2 = std::operator==(&command,",external");
            if (bVar2) {
              std::__cxx11::string::string(local_d0,(string *)&input);
              std::__cxx11::string::string((string *)&filename,local_d0);
              bVar2 = anon_unknown_1::is_cmd_command(&filename);
              if (!bVar2) {
                __assert_fail("is_cmd_command(txt)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/libskiwi.cpp"
                              ,0x266,
                              "std::string skiwi::(anonymous namespace)::get_cleaned_first_argument(std::string)"
                             );
              }
              std::__cxx11::string::~string((string *)&filename);
              std::__cxx11::string::find_first_not_of((char)local_d0,0x20);
              std::__cxx11::string::substr((ulong)&local_150,(ulong)local_d0);
              lVar5 = std::__cxx11::string::find((char)&local_150,0x20);
              if (lVar5 == -1) {
LAB_001fdb1b:
                paVar4 = &arg.field_2;
                psVar3 = &arg._M_string_length;
                arg._M_dataplus._M_p = (pointer)paVar4;
LAB_001fdb2a:
                *psVar3 = 0;
                paVar4->_M_local_buf[0] = '\0';
              }
              else {
                std::__cxx11::string::substr((ulong)local_50,(ulong)&local_150);
                std::__cxx11::string::operator=((string *)&local_150,local_50);
                std::__cxx11::string::~string(local_50);
                lVar5 = std::__cxx11::string::find_first_not_of((char)&local_150,0x20);
                if (lVar5 == -1) goto LAB_001fdb1b;
                std::__cxx11::string::substr((ulong)local_50,(ulong)&local_150);
                std::__cxx11::string::operator=((string *)&local_150,local_50);
                std::__cxx11::string::~string(local_50);
                lVar5 = std::__cxx11::string::find((char)&local_150,0x20);
                if (lVar5 == -1) {
                  arg._M_dataplus._M_p = (pointer)&arg.field_2;
                  paVar4 = &local_140;
                  if (local_150 == paVar4) {
                    arg.field_2._8_8_ = local_140._8_8_;
                  }
                  else {
                    arg._M_dataplus._M_p = (pointer)local_150;
                  }
                  arg.field_2._M_allocated_capacity._1_7_ = local_140._M_allocated_capacity._1_7_;
                  arg.field_2._M_local_buf[0] = local_140._M_local_buf[0];
                  arg._M_string_length = local_148;
                  psVar3 = &local_148;
                  local_150 = paVar4;
                  goto LAB_001fdb2a;
                }
                std::__cxx11::string::substr((ulong)&arg,(ulong)&local_150);
              }
              std::__cxx11::string::~string((string *)&local_150);
              std::__cxx11::string::~string(local_d0);
              skiwi_show_external_primitives(&arg);
              std::__cxx11::string::~string((string *)&arg);
            }
          }
        }
      }
      else if (cVar1 == 'm') {
        bVar2 = std::operator==(&command,",mem");
        if (bVar2) {
          skiwi_show_memory();
        }
      }
      else if (cVar1 == 'u') {
        bVar2 = std::operator==(&command,",unresolved");
        if (bVar2) {
          skiwi_show_unresolved();
        }
      }
    }
    std::__cxx11::string::~string((string *)&command);
  } while( true );
}

Assistant:

void skiwi_repl(int argc, char** argv)
  {
  using namespace SKIWI;
  if (!cd.initialized)
    throw std::runtime_error("Skiwi is not initialized");

  for (int i = 1; i < argc; ++i)
    {
    std::string filename(argv[i]);
    skiwi_runf(filename);
    }

  out(welcome_message);
  std::string input;
  bool quit = false;
  while (!quit)
    {
    out(prompt.c_str());

    std::getline(std::cin, input);

    bool cmd = is_cmd_command(input);
    if (cmd)
      {
      std::string command = get_cleaned_command(input);
      if (command.size() < 2)
        continue;
      switch (command[1])
        {
        case '?':
        {
        if (command == ",?")
          {
          skiwi_show_help();
          }
        break;
        }
        case 'a':
        {
        if (command == ",asm")
          {
          skiwi_show_assembly(input);
          }
        break;
        }
        case 'e':
        {
        if (command == ",env")
          {
          skiwi_show_environment();
          }
        else if (command == ",exit")
          {
          quit = true;
          }
        else if (command == ",expand")
          {
          skiwi_show_expand(input);
          }
        else if (command == ",external")
          {
          std::string arg = get_cleaned_first_argument(input);
          skiwi_show_external_primitives(arg);
          }
        break;
        }
        case 'm':
        {
        if (command == ",mem")
          {
          skiwi_show_memory();
          }
        break;
        }
        case 'u':
        {
        if (command == ",unresolved")
          {
          skiwi_show_unresolved();
          }
        break;
        }
        }
      }
    else if (!input.empty())
      {
      skiwi_run(input);
      }
    }
  }